

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeModel::sortItems(QTreeModel *this,QList<QTreeWidgetItem_*> *items,int column,SortOrder order)

{
  iterator __last;
  bool bVar1;
  int iVar2;
  iterator __first;
  qsizetype qVar3;
  const_reference ppQVar4;
  reference ppVar5;
  QList<QModelIndex> *this_00;
  const_reference ppVar6;
  QObjectData *pQVar7;
  QList<QTreeWidgetItem_*> *in_RSI;
  QList_conflict2 *in_RDI;
  long in_FS_OFFSET;
  int c;
  QTreeWidgetItem *item;
  int oldRow;
  int r;
  int colCount;
  _func_bool_pair<QTreeWidgetItem_ptr,_int>_ptr_pair<QTreeWidgetItem_ptr,_int>_ptr *compare;
  int i;
  QModelIndex to;
  QModelIndex from;
  QModelIndexList toList;
  QModelIndexList fromList;
  QList<std::pair<QTreeWidgetItem_*,_int>_> sorting;
  parameter_type in_stack_fffffffffffffec8;
  QTreeModel *in_stack_fffffffffffffed0;
  QTreeWidgetItem *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int local_104;
  int local_f0;
  int local_cc;
  QModelIndexWrapper local_98;
  undefined1 *local_80;
  undefined1 *local_78;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QList<std::pair<QTreeWidgetItem_*,_int>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isChanging(in_stack_fffffffffffffed0);
  if (!bVar1) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (pair<QTreeWidgetItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QTreeWidgetItem_*>::size(in_RSI);
    QList<std::pair<QTreeWidgetItem_*,_int>_>::QList
              ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)in_stack_fffffffffffffed0,
               (qsizetype)in_stack_fffffffffffffec8);
    local_cc = 0;
    while( true ) {
      __first.i = (pair<QTreeWidgetItem_*,_int> *)(long)local_cc;
      qVar3 = QList<std::pair<QTreeWidgetItem_*,_int>_>::size(&local_20);
      if (qVar3 <= (long)__first.i) break;
      ppQVar4 = QList<QTreeWidgetItem_*>::at
                          ((QList<QTreeWidgetItem_*> *)in_stack_fffffffffffffed0,
                           (qsizetype)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffed8 = *ppQVar4;
      ppVar5 = QList<std::pair<QTreeWidgetItem_*,_int>_>::operator[]
                         ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)in_stack_fffffffffffffed0,
                          (qsizetype)in_stack_fffffffffffffec8);
      ppVar5->first = in_stack_fffffffffffffed8;
      in_stack_fffffffffffffee4 = local_cc;
      ppVar5 = QList<std::pair<QTreeWidgetItem_*,_int>_>::operator[]
                         ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)in_stack_fffffffffffffed0,
                          (qsizetype)in_stack_fffffffffffffec8);
      ppVar5->second = in_stack_fffffffffffffee4;
      local_cc = local_cc + 1;
    }
    QList<std::pair<QTreeWidgetItem_*,_int>_>::begin
              ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)in_stack_fffffffffffffed0);
    QList<std::pair<QTreeWidgetItem_*,_int>_>::end
              ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)in_stack_fffffffffffffed0);
    __last.i._4_4_ = in_stack_fffffffffffffee4;
    __last.i._0_4_ = in_stack_fffffffffffffee0;
    std::
    stable_sort<QList<std::pair<QTreeWidgetItem*,int>>::iterator,bool(*)(std::pair<QTreeWidgetItem*,int>const&,std::pair<QTreeWidgetItem*,int>const&)>
              (__first,__last,
               (_func_bool_pair<QTreeWidgetItem_ptr,_int>_ptr_pair<QTreeWidgetItem_ptr,_int>_ptr *)
               in_stack_fffffffffffffec8);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x912043);
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x91207d);
    QModelIndex::QModelIndex((QModelIndex *)0x91208a);
    iVar2 = (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_68);
    local_f0 = 0;
    while( true ) {
      this_00 = (QList<QModelIndex> *)(long)local_f0;
      qVar3 = QList<std::pair<QTreeWidgetItem_*,_int>_>::size(&local_20);
      if (qVar3 <= (long)this_00) break;
      ppVar6 = QList<std::pair<QTreeWidgetItem_*,_int>_>::at
                         ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)this_00,
                          (qsizetype)in_stack_fffffffffffffec8);
      if (ppVar6->second != local_f0) {
        QList<std::pair<QTreeWidgetItem_*,_int>_>::at
                  ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)this_00,
                   (qsizetype)in_stack_fffffffffffffec8);
        QList<QTreeWidgetItem_*>::replace
                  ((QList<QTreeWidgetItem_*> *)__first.i,
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8);
        for (local_104 = 0; local_104 < iVar2; local_104 = local_104 + 1) {
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_70.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          QAbstractItemModel::createIndex
                    ((QAbstractItemModel *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                     this_00);
          pQVar7 = QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::data
                             ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
                              (in_RDI + 8));
          in_stack_fffffffffffffec8 = (parameter_type)(pQVar7 + 0x90);
          QtPrivate::QModelIndexWrapper::QModelIndexWrapper(&local_98,(QModelIndex *)&local_80);
          bVar1 = QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::contains
                            ((QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>
                              *)in_stack_fffffffffffffed8,(QModelIndexWrapper *)this_00);
          if (bVar1) {
            QAbstractItemModel::createIndex
                      ((QAbstractItemModel *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                       (int)in_stack_fffffffffffffed8,this_00);
            QList<QModelIndex>::operator<<(this_00,in_stack_fffffffffffffec8);
            QList<QModelIndex>::operator<<(this_00,in_stack_fffffffffffffec8);
          }
        }
      }
      local_f0 = local_f0 + 1;
    }
    QAbstractItemModel::changePersistentIndexList(in_RDI,(QList_conflict2 *)&local_38);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x912291);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x91229e);
    QList<std::pair<QTreeWidgetItem_*,_int>_>::~QList
              ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)0x9122ab);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeModel::sortItems(QList<QTreeWidgetItem*> *items, int column, Qt::SortOrder order)
{
    // see QTreeViewItem::operator<
    Q_UNUSED(column);
    if (isChanging())
        return;

    // store the original order of indexes
    QList<std::pair<QTreeWidgetItem *, int>> sorting(items->size());
    for (int i = 0; i < sorting.size(); ++i) {
        sorting[i].first = items->at(i);
        sorting[i].second = i;
    }

    // do the sorting
    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sorting.begin(), sorting.end(), compare);

    QModelIndexList fromList;
    QModelIndexList toList;
    int colCount = columnCount();
    for (int r = 0; r < sorting.size(); ++r) {
        int oldRow = sorting.at(r).second;
        if (oldRow == r)
            continue;
        QTreeWidgetItem *item = sorting.at(r).first;
        items->replace(r, item);
        for (int c = 0; c < colCount; ++c) {
            QModelIndex from = createIndex(oldRow, c, item);
            if (static_cast<QAbstractItemModelPrivate *>(d_ptr.data())->persistent.indexes.contains(from)) {
                QModelIndex to = createIndex(r, c, item);
                fromList << from;
                toList << to;
            }
        }
    }
    changePersistentIndexList(fromList, toList);
}